

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compression.cpp
# Opt level: O3

void doWriteRead(pixels *p,string *filename,string *cppfilename,bool tiled,int xs,int ys,
                exr_compression_t comp,char *pattern)

{
  Channel *pCVar1;
  Slice *pSVar2;
  void *pvVar3;
  bool tiled_00;
  uint uVar4;
  ulong uVar5;
  string *psVar6;
  undefined8 uVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  size_t sVar11;
  ostream *poVar12;
  long *plVar13;
  ulong uVar14;
  exr_compression_t *peVar15;
  undefined4 *puVar16;
  char *pcVar17;
  undefined7 in_register_00000009;
  int *piVar18;
  pixels *ppVar19;
  int32_t *func;
  pixels *ppVar20;
  exr_context_t p_Var21;
  int iVar22;
  int iVar23;
  int32_t iVar24;
  char *pcVar25;
  undefined4 in_register_00000084;
  undefined4 in_register_0000008c;
  string *psVar26;
  long lVar27;
  char cVar28;
  long lVar29;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *pvVar30;
  float fVar31;
  float fVar32;
  int in_stack_fffffffffffffa78;
  int partidx;
  char *local_580;
  exr_context_t f;
  uint local_56c;
  undefined8 local_568;
  uint local_55c;
  pixels *local_558;
  int32_t tilew;
  int local_54c;
  char *local_548;
  int32_t tileh;
  int32_t tlevy;
  undefined4 local_534;
  long local_530;
  exr_context_t local_528;
  ulong local_520;
  string *local_518;
  pixels *local_510;
  int local_504;
  int local_500;
  int local_4fc;
  int local_4f8;
  int local_4f4;
  int local_4f0;
  int zlev;
  int32_t local_4e8;
  int32_t pixelstride;
  string *local_4e0;
  ulong local_4d8;
  exr_attr_box2i_t dataW;
  pixels cpprestore;
  pixels cpploadc;
  char local_350 [88];
  undefined4 local_2f8;
  undefined4 uStack_2f4;
  undefined8 uStack_2f0;
  pixels cpploadcpp;
  pixels restore;
  
  local_580 = (char *)CONCAT44(in_register_0000008c,ys);
  local_568 = CONCAT44(in_register_00000084,xs);
  local_55c = (uint)CONCAT71(in_register_00000009,tiled);
  lVar27 = (long)p->_w * (long)xs;
  pcVar25 = (char *)((long)p->_h * (long)ys);
  uVar10 = xs * 0x11;
  local_4d8 = (ulong)uVar10;
  uVar4 = ys * 0x1d;
  local_520 = (ulong)uVar4;
  uStack_2f0 = 0;
  local_350[0x48] = '\0';
  local_350[0x49] = '\0';
  local_350[0x4a] = '\0';
  local_350[0x4b] = '\0';
  local_350[0x4c] = '\0';
  local_350[0x4d] = '\0';
  local_350[0x4e] = '\0';
  local_350[0x4f] = '\0';
  local_350[0x50] = '\0';
  local_350[0x51] = '\0';
  local_350[0x52] = '\0';
  local_350[0x53] = '\0';
  local_350[0x54] = '\0';
  local_350[0x55] = '\0';
  local_350[0x56] = '\0';
  local_350[0x57] = '\0';
  local_350[0x38] = '\0';
  local_350[0x39] = '\0';
  local_350[0x3a] = '\0';
  local_350[0x3b] = '\0';
  local_350[0x3c] = '\0';
  local_350[0x3d] = '\0';
  local_350[0x3e] = '\0';
  local_350[0x3f] = '\0';
  local_350[0x40] = '\0';
  local_350[0x41] = '\0';
  local_350[0x42] = '\0';
  local_350[0x43] = '\0';
  local_350[0x44] = '\0';
  local_350[0x45] = '\0';
  local_350[0x46] = '\0';
  local_350[0x47] = '\0';
  local_350[0x28] = '\0';
  local_350[0x29] = '\0';
  local_350[0x2a] = '\0';
  local_350[0x2b] = '\0';
  local_350[0x2c] = '\0';
  local_350[0x2d] = '\0';
  local_350[0x2e] = '\0';
  local_350[0x2f] = '\0';
  local_350[0x30] = '\0';
  local_350[0x31] = '\0';
  local_350[0x32] = '\0';
  local_350[0x33] = '\0';
  local_350[0x34] = '\0';
  local_350[0x35] = '\0';
  local_350[0x36] = '\0';
  local_350[0x37] = '\0';
  local_350[0x18] = '\0';
  local_350[0x19] = '\0';
  local_350[0x1a] = '\0';
  local_350[0x1b] = '\0';
  local_350[0x1c] = '\0';
  local_350[0x1d] = '\0';
  local_350[0x1e] = '\0';
  local_350[0x1f] = '\0';
  local_350[0x20] = '\0';
  local_350[0x21] = '\0';
  local_350[0x22] = '\0';
  local_350[0x23] = '\0';
  local_350[0x24] = '\0';
  local_350[0x25] = '\0';
  local_350[0x26] = '\0';
  local_350[0x27] = '\0';
  local_350[8] = '\0';
  local_350[9] = '\0';
  local_350[10] = '\0';
  local_350[0xb] = '\0';
  local_350[0xc] = '\0';
  local_350[0xd] = '\0';
  local_350[0xe] = '\0';
  local_350[0xf] = '\0';
  local_350[0x10] = '\0';
  local_350[0x11] = '\0';
  local_350[0x12] = '\0';
  local_350[0x13] = '\0';
  local_350[0x14] = '\0';
  local_350[0x15] = '\0';
  local_350[0x16] = '\0';
  local_350[0x17] = '\0';
  local_350[0] = 'h';
  local_350[1] = '\0';
  local_350[2] = '\0';
  local_350[3] = '\0';
  local_350[4] = '\0';
  local_350[5] = '\0';
  local_350[6] = '\0';
  local_350[7] = '\0';
  local_2f8 = 0;
  uStack_2f4 = 0xbf800000;
  local_558 = p;
  local_548 = pcVar25;
  local_530 = lVar27;
  local_518 = cppfilename;
  exr_set_default_zip_compression_level(0xffffffff);
  _local_2f8 = CONCAT44(uStack_2f4,3);
  uStack_2f0 = CONCAT44(uStack_2f0._4_4_,8);
  local_4f8 = (int)lVar27 + -1 + uVar10;
  iVar22 = (int)pcVar25 + -1 + uVar4;
  dataW.min.field_0.field_0.x = uVar10;
  dataW.min.field_0.field_0.y = uVar4;
  dataW.max.field_0.field_0.x = local_4f8;
  dataW.max.field_0.field_0.y = iVar22;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  ",2);
  local_4fc = iVar22;
  if (pattern == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1985a0);
  }
  else {
    sVar11 = strlen(pattern);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pattern,sVar11);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," tiled: ",8);
  pcVar25 = "no";
  cVar28 = (char)local_55c;
  if (cVar28 != '\0') {
    pcVar25 = "yes";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,pcVar25,(ulong)(local_55c & 0xff) | 2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," sampling ",10);
  poVar12 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(int)local_568);
  std::__ostream_insert<char,std::char_traits<char>>(poVar12,", ",2);
  poVar12 = (ostream *)std::ostream::operator<<(poVar12,(int)local_580);
  std::__ostream_insert<char,std::char_traits<char>>(poVar12," comp ",6);
  plVar13 = (long *)std::ostream::operator<<(poVar12,comp);
  std::ios::widen((char)*(undefined8 *)(*plVar13 + -0x18) + (char)plVar13);
  std::ostream::put((char)plVar13);
  std::ostream::flush();
  pcVar25 = local_350;
  iVar22 = exr_start_write(&f,(filename->_M_dataplus)._M_p,0);
  if (iVar22 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar12 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar22);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,") ",2);
    pcVar17 = (char *)exr_get_default_error_message(iVar22);
    if (pcVar17 == (char *)0x0) {
      std::ios::clear((int)poVar12 + (int)*(undefined8 *)(*(long *)poVar12 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar17);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,pcVar17,sVar11);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
    std::ostream::put((char)poVar12);
    std::ostream::flush();
    core_test_fail("exr_start_write ( &f, filename.c_str (), EXR_WRITE_FILE_DIRECTLY, &cinit)",
                   (char *)0x505,0x179b65,pcVar25);
  }
  if (cVar28 == '\0') {
    piVar18 = &partidx;
    iVar22 = exr_add_part(f,"scan",0);
    if (iVar22 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar12 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar22);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,") ",2);
      pcVar25 = (char *)exr_get_default_error_message(iVar22);
      if (pcVar25 == (char *)0x0) {
        std::ios::clear((int)poVar12 + (int)*(undefined8 *)(*(long *)poVar12 + -0x18));
      }
      else {
        sVar11 = strlen(pcVar25);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,pcVar25,sVar11);
      }
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
      std::ostream::put((char)poVar12);
      std::ostream::flush();
      core_test_fail("exr_add_part (f, \"scan\", EXR_STORAGE_SCANLINE, &partidx)",(char *)0x50e,
                     0x179b65,(char *)piVar18);
    }
  }
  else {
    piVar18 = &partidx;
    iVar22 = exr_add_part(f,"tiled",1);
    if (iVar22 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar12 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar22);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,") ",2);
      pcVar25 = (char *)exr_get_default_error_message(iVar22);
      if (pcVar25 == (char *)0x0) {
        std::ios::clear((int)poVar12 + (int)*(undefined8 *)(*(long *)poVar12 + -0x18));
      }
      else {
        sVar11 = strlen(pcVar25);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,pcVar25,sVar11);
      }
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
      std::ostream::put((char)poVar12);
      std::ostream::flush();
      core_test_fail("exr_add_part (f, \"tiled\", EXR_STORAGE_TILED, &partidx)",(char *)0x509,
                     0x179b65,(char *)piVar18);
    }
  }
  pcVar25 = local_548;
  iVar22 = exr_initialize_required_attr_simple(f,partidx,local_530);
  if (iVar22 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar12 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar22);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,") ",2);
    pcVar17 = (char *)exr_get_default_error_message(iVar22);
    if (pcVar17 == (char *)0x0) {
      std::ios::clear((int)poVar12 + (int)*(undefined8 *)(*(long *)poVar12 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar17);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,pcVar17,sVar11);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
    std::ostream::put((char)poVar12);
    std::ostream::flush();
    core_test_fail("exr_initialize_required_attr_simple (f, partidx, fw, fh, comp)",(char *)0x512,
                   0x179b65,pcVar25);
  }
  iVar22 = exr_set_data_window(f,partidx,&dataW);
  if (iVar22 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar12 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar22);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,") ",2);
    pcVar17 = (char *)exr_get_default_error_message(iVar22);
    if (pcVar17 == (char *)0x0) {
      std::ios::clear((int)poVar12 + (int)*(undefined8 *)(*(long *)poVar12 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar17);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,pcVar17,sVar11);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
    std::ostream::put((char)poVar12);
    std::ostream::flush();
    core_test_fail("exr_set_data_window (f, partidx, &dataW)",(char *)0x513,0x179b65,pcVar25);
  }
  iVar22 = exr_get_zip_compression_level(f,partidx,&zlev);
  if (iVar22 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar12 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar22);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,") ",2);
    pcVar17 = (char *)exr_get_default_error_message(iVar22);
    if (pcVar17 == (char *)0x0) {
      std::ios::clear((int)poVar12 + (int)*(undefined8 *)(*(long *)poVar12 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar17);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,pcVar17,sVar11);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
    std::ostream::put((char)poVar12);
    std::ostream::flush();
    core_test_fail("exr_get_zip_compression_level (f, partidx, &zlev)",(char *)0x516,0x179b65,
                   pcVar25);
  }
  if (zlev != 3) {
    core_test_fail("zlev == 3",(char *)0x517,0x179b65,pcVar25);
  }
  iVar22 = exr_set_zip_compression_level(f,partidx,4);
  if (iVar22 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar12 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar22);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,") ",2);
    pcVar17 = (char *)exr_get_default_error_message(iVar22);
    if (pcVar17 == (char *)0x0) {
      std::ios::clear((int)poVar12 + (int)*(undefined8 *)(*(long *)poVar12 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar17);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,pcVar17,sVar11);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
    std::ostream::put((char)poVar12);
    std::ostream::flush();
    core_test_fail("exr_set_zip_compression_level (f, partidx, 4)",(char *)0x518,0x179b65,pcVar25);
  }
  if ((char)local_55c != '\0') {
    pcVar25 = (char *)0x20;
    iVar22 = exr_set_tile_descriptor(f,partidx,0x20,0x20,0,1);
    if (iVar22 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar12 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar22);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,") ",2);
      pcVar17 = (char *)exr_get_default_error_message(iVar22);
      if (pcVar17 == (char *)0x0) {
        std::ios::clear((int)poVar12 + (int)*(undefined8 *)(*(long *)poVar12 + -0x18));
      }
      else {
        sVar11 = strlen(pcVar17);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,pcVar17,sVar11);
      }
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
      std::ostream::put((char)poVar12);
      std::ostream::flush();
      core_test_fail("exr_set_tile_descriptor ( f, partidx, 32, 32, EXR_TILE_ONE_LEVEL, EXR_TILE_ROUND_UP)"
                     ,(char *)0x51c,0x179b65,pcVar25);
    }
  }
  pcVar25 = (char *)0x0;
  iVar22 = exr_add_channel(f,partidx,"I",0,0,local_568,local_580);
  if (iVar22 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar12 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar22);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,") ",2);
    pcVar17 = (char *)exr_get_default_error_message(iVar22);
    if (pcVar17 == (char *)0x0) {
      std::ios::clear((int)poVar12 + (int)*(undefined8 *)(*(long *)poVar12 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar17);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,pcVar17,sVar11);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
    std::ostream::put((char)poVar12);
    std::ostream::flush();
    core_test_fail("exr_add_channel ( f, partidx, \"I\", EXR_PIXEL_UINT, EXR_PERCEPTUALLY_LOGARITHMIC, xs, ys)"
                   ,(char *)0x520,0x179b65,pcVar25);
  }
  local_500 = (int)local_530 + -1;
  local_504 = (int)local_548 + -1;
  lVar27 = 0;
  do {
    pcVar25 = (char *)0x1;
    iVar22 = exr_add_channel(f,partidx,*(undefined8 *)((long)channels + lVar27),1,0,local_568,
                             local_580);
    if (iVar22 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar12 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar22);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,") ",2);
      pcVar17 = (char *)exr_get_default_error_message(iVar22);
      if (pcVar17 == (char *)0x0) {
        std::ios::clear((int)poVar12 + (int)*(undefined8 *)(*(long *)poVar12 + -0x18));
      }
      else {
        sVar11 = strlen(pcVar17);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,pcVar17,sVar11);
      }
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
      std::ostream::put((char)poVar12);
      std::ostream::flush();
      core_test_fail("exr_add_channel ( f, partidx, channels[c], EXR_PIXEL_HALF, EXR_PERCEPTUALLY_LOGARITHMIC, xs, ys)"
                     ,(char *)0x52b,0x179b65,pcVar25);
    }
    lVar27 = lVar27 + 8;
  } while (lVar27 != 0x28);
  ppVar19 = (pixels *)0x2;
  iVar22 = exr_add_channel(f,partidx,"F",2,0,local_568,local_580);
  if (iVar22 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar12 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar22);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,") ",2);
    pcVar25 = (char *)exr_get_default_error_message(iVar22);
    if (pcVar25 == (char *)0x0) {
      std::ios::clear((int)poVar12 + (int)*(undefined8 *)(*(long *)poVar12 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar25);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,pcVar25,sVar11);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
    std::ostream::put((char)poVar12);
    std::ostream::flush();
    core_test_fail("exr_add_channel ( f, partidx, \"F\", EXR_PIXEL_FLOAT, EXR_PERCEPTUALLY_LOGARITHMIC, xs, ys)"
                   ,(char *)0x534,0x179b65,(char *)ppVar19);
  }
  iVar22 = exr_write_header(f);
  p_Var21 = f;
  if (iVar22 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar12 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar22);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,") ",2);
    pcVar25 = (char *)exr_get_default_error_message(iVar22);
    if (pcVar25 == (char *)0x0) {
      std::ios::clear((int)poVar12 + (int)*(undefined8 *)(*(long *)poVar12 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar25);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,pcVar25,sVar11);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
    std::ostream::put((char)poVar12);
    std::ostream::flush();
    core_test_fail("exr_write_header (f)",(char *)0x536,0x179b65,(char *)ppVar19);
  }
  local_528 = f;
  local_4e0 = filename;
  if ((char)local_55c == '\0') {
    cpploadcpp._0_8_ = cpploadcpp._0_8_ & 0xffffffff00000000;
    iVar22 = exr_get_scanlines_per_chunk(f,0);
    if (iVar22 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar12 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar22);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,") ",2);
      pcVar25 = (char *)exr_get_default_error_message(iVar22);
      if (pcVar25 == (char *)0x0) {
        std::ios::clear((int)poVar12 + (int)*(undefined8 *)(*(long *)poVar12 + -0x18));
      }
      else {
        sVar11 = strlen(pcVar25);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,pcVar25,sVar11);
      }
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
      std::ostream::put((char)poVar12);
      std::ostream::flush();
      core_test_fail("exr_get_scanlines_per_chunk (f, 0, &scansperchunk)",(char *)0x2ef,0x17a26e,
                     (char *)ppVar19);
    }
    local_54c = (int)local_580 * 0xbc;
    if ((int)local_520 < local_54c) {
      local_56c = (uint)CONCAT71((uint7)(uint3)((uint)local_54c >> 8),1);
      uVar14 = local_520 & 0xffffffff;
      do {
        uVar5 = local_520;
        ppVar19 = &restore;
        ppVar20 = &cpprestore;
        iVar22 = exr_write_scanline_chunk_info(local_528,0,uVar14);
        if (iVar22 != 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Return Error: (",0xf);
          poVar12 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar22);
          std::__ostream_insert<char,std::char_traits<char>>(poVar12,") ",2);
          pcVar25 = (char *)exr_get_default_error_message(iVar22);
          if (pcVar25 == (char *)0x0) {
            std::ios::clear((int)poVar12 + (int)*(undefined8 *)(*(long *)poVar12 + -0x18));
          }
          else {
            sVar11 = strlen(pcVar25);
            std::__ostream_insert<char,std::char_traits<char>>(poVar12,pcVar25,sVar11);
          }
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
          std::ostream::put((char)poVar12);
          std::ostream::flush();
          core_test_fail("exr_write_scanline_chunk_info (f, 0, y, &cinfo)",(char *)0x2f4,0x17a26e,
                         (char *)ppVar20);
        }
        if ((local_56c & 1) == 0) {
          iVar22 = exr_encoding_update(local_528,0,&cpprestore);
          if (iVar22 != 0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"Return Error: (",0xf);
            poVar12 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar22);
            std::__ostream_insert<char,std::char_traits<char>>(poVar12,") ",2);
            pcVar25 = (char *)exr_get_default_error_message(iVar22);
            if (pcVar25 == (char *)0x0) {
              std::ios::clear((int)poVar12 + (int)*(undefined8 *)(*(long *)poVar12 + -0x18));
            }
            else {
              sVar11 = strlen(pcVar25);
              std::__ostream_insert<char,std::char_traits<char>>(poVar12,pcVar25,sVar11);
            }
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
            std::ostream::put((char)poVar12);
            std::ostream::flush();
            core_test_fail("exr_encoding_update (f, 0, &cinfo, &encoder)",(char *)0x2fc,0x17a26e,
                           (char *)ppVar19);
          }
        }
        else {
          iVar22 = exr_encoding_initialize(local_528,0,&cpprestore);
          if (iVar22 != 0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"Return Error: (",0xf);
            poVar12 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar22);
            std::__ostream_insert<char,std::char_traits<char>>(poVar12,") ",2);
            pcVar25 = (char *)exr_get_default_error_message(iVar22);
            if (pcVar25 == (char *)0x0) {
              std::ios::clear((int)poVar12 + (int)*(undefined8 *)(*(long *)poVar12 + -0x18));
            }
            else {
              sVar11 = strlen(pcVar25);
              std::__ostream_insert<char,std::char_traits<char>>(poVar12,pcVar25,sVar11);
            }
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
            std::ostream::put((char)poVar12);
            std::ostream::flush();
            core_test_fail("exr_encoding_initialize (f, 0, &cinfo, &encoder)",(char *)0x2f8,0x17a26e
                           ,(char *)ppVar19);
          }
        }
        iVar22 = ((int)uVar14 - (int)uVar5) / (int)local_580;
        if (0 < (short)restore._stride_x) {
          iVar8 = local_558->_stride_x;
          lVar29 = 0;
          lVar27 = 0;
          ppVar20 = local_558;
          do {
            uVar7 = restore._0_8_;
            if (*(int *)(restore._0_8_ + 8 + lVar29) == 0) {
              *(undefined8 *)(restore._0_8_ + 0x28 + lVar29) = 0;
              *(undefined4 *)(restore._0_8_ + 0x20 + lVar29) = 0;
              iVar24 = 0;
            }
            else {
              ppVar19 = &cpploadc;
              fill_pointers(ppVar20,(exr_coding_channel_info_t *)(lVar29 + restore._0_8_),
                            iVar22 * iVar8,(void **)ppVar19,&tlevy,&tilew);
              iVar23 = (int)*(short *)(uVar7 + 0x1c + lVar29);
              if (tlevy != iVar23) {
                core_test_fail("curchan.user_bytes_per_element == pixelstride",(char *)0x314,
                               0x17a26e,(char *)ppVar19);
              }
              ppVar19 = (pixels *)CONCAT44(cpploadc._h,cpploadc._w);
              *(pixels **)(restore._0_8_ + 0x28 + lVar29) = ppVar19;
              *(int *)(restore._0_8_ + 0x20 + lVar29) = iVar23;
              ppVar20 = local_558;
              iVar24 = tilew;
            }
            *(int32_t *)(restore._0_8_ + 0x24 + lVar29) = iVar24;
            lVar27 = lVar27 + 1;
            lVar29 = lVar29 + 0x30;
          } while (lVar27 < (short)restore._stride_x);
        }
        p_Var21 = local_528;
        if ((local_56c & 1) != 0) {
          iVar22 = exr_encoding_choose_default_routines(local_528,0,&restore);
          if (iVar22 != 0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"Return Error: (",0xf);
            poVar12 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar22);
            std::__ostream_insert<char,std::char_traits<char>>(poVar12,") ",2);
            pcVar25 = (char *)exr_get_default_error_message(iVar22);
            if (pcVar25 == (char *)0x0) {
              std::ios::clear((int)poVar12 + (int)*(undefined8 *)(*(long *)poVar12 + -0x18));
            }
            else {
              sVar11 = strlen(pcVar25);
              std::__ostream_insert<char,std::char_traits<char>>(poVar12,pcVar25,sVar11);
            }
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
            std::ostream::put((char)poVar12);
            std::ostream::flush();
            core_test_fail("exr_encoding_choose_default_routines (f, 0, &encoder)",(char *)0x31e,
                           0x17a26e,(char *)ppVar19);
          }
        }
        iVar22 = exr_encoding_run(p_Var21,0,&restore);
        if (iVar22 != 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Return Error: (",0xf);
          poVar12 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar22);
          std::__ostream_insert<char,std::char_traits<char>>(poVar12,") ",2);
          pcVar25 = (char *)exr_get_default_error_message(iVar22);
          if (pcVar25 == (char *)0x0) {
            std::ios::clear((int)poVar12 + (int)*(undefined8 *)(*(long *)poVar12 + -0x18));
          }
          else {
            sVar11 = strlen(pcVar25);
            std::__ostream_insert<char,std::char_traits<char>>(poVar12,pcVar25,sVar11);
          }
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
          std::ostream::put((char)poVar12);
          std::ostream::flush();
          core_test_fail("exr_encoding_run (f, 0, &encoder)",(char *)0x320,0x17a26e,(char *)ppVar19)
          ;
        }
        uVar10 = (int)uVar14 + cpploadcpp._w;
        uVar14 = (ulong)uVar10;
        local_56c = 0;
      } while ((int)uVar10 < local_54c);
    }
    iVar22 = exr_encoding_destroy(local_528,&restore);
    if (iVar22 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar12 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar22);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,") ",2);
      pcVar25 = (char *)exr_get_default_error_message(iVar22);
      if (pcVar25 == (char *)0x0) {
        std::ios::clear((int)poVar12 + (int)*(undefined8 *)(*(long *)poVar12 + -0x18));
      }
      else {
        sVar11 = strlen(pcVar25);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,pcVar25,sVar11);
      }
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
      std::ostream::put((char)poVar12);
      std::ostream::flush();
      core_test_fail("exr_encoding_destroy (f, &encoder)",(char *)0x324,0x17a26e,(char *)ppVar19);
    }
  }
  else {
    if (((int)local_568 != 1) || ((int)local_580 != 1)) {
      core_test_fail("xs == 1 && ys == 1",(char *)0x335,0x179fb4,(char *)ppVar19);
    }
    func = &tlevy;
    iVar22 = exr_get_tile_levels(f,0,&cpploadcpp);
    if (iVar22 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar12 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar22);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,") ",2);
      pcVar25 = (char *)exr_get_default_error_message(iVar22);
      if (pcVar25 == (char *)0x0) {
        std::ios::clear((int)poVar12 + (int)*(undefined8 *)(*(long *)poVar12 + -0x18));
      }
      else {
        sVar11 = strlen(pcVar25);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,pcVar25,sVar11);
      }
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
      std::ostream::put((char)poVar12);
      std::ostream::flush();
      core_test_fail("exr_get_tile_levels (f, 0, &tlevx, &tlevy)",(char *)0x336,0x179fb4,
                     (char *)func);
    }
    if ((cpploadcpp._w != 1) || (tlevy != 1)) {
      core_test_fail("tlevx == 1 && tlevy == 1",(char *)0x337,0x179fb4,(char *)func);
    }
    pcVar25 = (char *)0x0;
    uVar14 = exr_get_tile_sizes(p_Var21,0,0,0,&tilew,&tileh);
    if ((int)uVar14 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar12 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,(int)uVar14);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,") ",2);
      pcVar17 = (char *)exr_get_default_error_message(uVar14 & 0xffffffff);
      if (pcVar17 == (char *)0x0) {
        std::ios::clear((int)poVar12 + (int)*(undefined8 *)(*(long *)poVar12 + -0x18));
      }
      else {
        sVar11 = strlen(pcVar17);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,pcVar17,sVar11);
      }
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
      std::ostream::put((char)poVar12);
      std::ostream::flush();
      core_test_fail("exr_get_tile_sizes (f, 0, 0, 0, &tilew, &tileh)",(char *)0x339,0x179fb4,
                     pcVar25);
    }
    if ((tilew != 0x20) || (tileh != 0x20)) {
      core_test_fail("tilew == 32 && tileh == 32",(char *)0x33a,0x179fb4,pcVar25);
    }
    local_56c = (uint)CONCAT71((int7)(uVar14 >> 8),1);
    iVar22 = 0x1d;
    local_510 = (pixels *)0x0;
    do {
      iVar8 = 0x11;
      local_4f4 = iVar22;
      iVar22 = 0;
      do {
        local_54c = iVar22;
        ppVar19 = &restore;
        ppVar20 = local_510;
        local_4f0 = iVar8;
        iVar22 = exr_write_tile_chunk_info(p_Var21,0);
        if (iVar22 != 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Return Error: (",0xf);
          poVar12 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar22);
          std::__ostream_insert<char,std::char_traits<char>>(poVar12,") ",2);
          pcVar25 = (char *)exr_get_default_error_message(iVar22);
          if (pcVar25 == (char *)0x0) {
            std::ios::clear((int)poVar12 + (int)*(undefined8 *)(*(long *)poVar12 + -0x18));
          }
          else {
            sVar11 = strlen(pcVar25);
            std::__ostream_insert<char,std::char_traits<char>>(poVar12,pcVar25,sVar11);
          }
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
          std::ostream::put((char)poVar12);
          std::ostream::flush();
          core_test_fail("exr_write_tile_chunk_info (f, 0, tilex, tiley, 0, 0, &cinfo)",
                         (char *)0x348,0x179fb4,(char *)ppVar20);
        }
        if ((local_56c & 1) == 0) {
          iVar22 = exr_encoding_update(p_Var21,0,&cpprestore);
          if (iVar22 != 0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"Return Error: (",0xf);
            poVar12 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar22);
            std::__ostream_insert<char,std::char_traits<char>>(poVar12,") ",2);
            pcVar25 = (char *)exr_get_default_error_message(iVar22);
            if (pcVar25 == (char *)0x0) {
              std::ios::clear((int)poVar12 + (int)*(undefined8 *)(*(long *)poVar12 + -0x18));
            }
            else {
              sVar11 = strlen(pcVar25);
              std::__ostream_insert<char,std::char_traits<char>>(poVar12,pcVar25,sVar11);
            }
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
            std::ostream::put((char)poVar12);
            std::ostream::flush();
            core_test_fail("exr_encoding_update (f, 0, &cinfo, &encoder)",(char *)0x351,0x179fb4,
                           (char *)ppVar19);
          }
        }
        else {
          iVar22 = exr_encoding_initialize(p_Var21,0,&cpprestore);
          if (iVar22 != 0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"Return Error: (",0xf);
            poVar12 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar22);
            std::__ostream_insert<char,std::char_traits<char>>(poVar12,") ",2);
            pcVar25 = (char *)exr_get_default_error_message(iVar22);
            if (pcVar25 == (char *)0x0) {
              std::ios::clear((int)poVar12 + (int)*(undefined8 *)(*(long *)poVar12 + -0x18));
            }
            else {
              sVar11 = strlen(pcVar25);
              std::__ostream_insert<char,std::char_traits<char>>(poVar12,pcVar25,sVar11);
            }
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
            std::ostream::put((char)poVar12);
            std::ostream::flush();
            core_test_fail("exr_encoding_initialize (f, 0, &cinfo, &encoder)",(char *)0x34c,0x179fb4
                           ,(char *)ppVar19);
          }
        }
        if (0 < (short)restore._stride_x) {
          iVar8 = tileh * (int)local_510;
          iVar22 = local_558->_stride_x;
          iVar23 = tilew * local_54c;
          lVar29 = 0;
          lVar27 = 0;
          do {
            uVar7 = restore._0_8_;
            ppVar19 = &cpploadc;
            fill_pointers(local_558,(exr_coding_channel_info_t *)(restore._0_8_ + lVar29),
                          iVar23 + iVar8 * iVar22,(void **)ppVar19,&pixelstride,&local_4e8);
            iVar9 = (int)*(short *)(uVar7 + 0x1c + lVar29);
            if (pixelstride != iVar9) {
              core_test_fail("curchan.user_bytes_per_element == pixelstride",(char *)0x361,0x179fb4,
                             (char *)ppVar19);
            }
            ppVar19 = (pixels *)CONCAT44(cpploadc._h,cpploadc._w);
            *(pixels **)(restore._0_8_ + 0x28 + lVar29) = ppVar19;
            *(int *)(restore._0_8_ + 0x20 + lVar29) = iVar9;
            *(int32_t *)(restore._0_8_ + 0x24 + lVar29) = local_4e8;
            lVar27 = lVar27 + 1;
            lVar29 = lVar29 + 0x30;
          } while (lVar27 < (short)restore._stride_x);
        }
        p_Var21 = local_528;
        if ((local_56c & 1) != 0) {
          iVar22 = exr_encoding_choose_default_routines(local_528,0,&restore);
          if (iVar22 != 0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"Return Error: (",0xf);
            poVar12 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar22);
            std::__ostream_insert<char,std::char_traits<char>>(poVar12,") ",2);
            pcVar25 = (char *)exr_get_default_error_message(iVar22);
            if (pcVar25 == (char *)0x0) {
              std::ios::clear((int)poVar12 + (int)*(undefined8 *)(*(long *)poVar12 + -0x18));
            }
            else {
              sVar11 = strlen(pcVar25);
              std::__ostream_insert<char,std::char_traits<char>>(poVar12,pcVar25,sVar11);
            }
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
            std::ostream::put((char)poVar12);
            std::ostream::flush();
            core_test_fail("exr_encoding_choose_default_routines (f, 0, &encoder)",(char *)0x36b,
                           0x179fb4,(char *)ppVar19);
          }
        }
        iVar22 = exr_encoding_run(p_Var21,0,&restore);
        if (iVar22 != 0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Return Error: (",0xf);
          poVar12 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar22);
          std::__ostream_insert<char,std::char_traits<char>>(poVar12,") ",2);
          pcVar25 = (char *)exr_get_default_error_message(iVar22);
          if (pcVar25 == (char *)0x0) {
            std::ios::clear((int)poVar12 + (int)*(undefined8 *)(*(long *)poVar12 + -0x18));
          }
          else {
            sVar11 = strlen(pcVar25);
            std::__ostream_insert<char,std::char_traits<char>>(poVar12,pcVar25,sVar11);
          }
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
          std::ostream::put((char)poVar12);
          std::ostream::flush();
          core_test_fail("exr_encoding_run (f, 0, &encoder)",(char *)0x36d,0x179fb4,(char *)ppVar19)
          ;
        }
        iVar8 = local_4f0 + tilew;
        local_56c = 0;
        iVar22 = local_54c + 1;
      } while (iVar8 < 0x56c);
      iVar22 = local_4f4 + tileh;
      ppVar19 = (pixels *)(ulong)((int)local_510 + 1);
      local_56c = 0;
      local_510 = ppVar19;
    } while (iVar22 < 0xbc);
    iVar22 = exr_encoding_destroy(p_Var21,&restore);
    if (iVar22 != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Return Error: (",0xf);
      poVar12 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar22);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,") ",2);
      pcVar25 = (char *)exr_get_default_error_message(iVar22);
      if (pcVar25 == (char *)0x0) {
        std::ios::clear((int)poVar12 + (int)*(undefined8 *)(*(long *)poVar12 + -0x18));
      }
      else {
        sVar11 = strlen(pcVar25);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,pcVar25,sVar11);
      }
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
      std::ostream::put((char)poVar12);
      std::ostream::flush();
      core_test_fail("exr_encoding_destroy (f, &encoder)",(char *)0x371,0x179fb4,(char *)ppVar19);
    }
  }
  iVar22 = exr_finish(&f);
  if (iVar22 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar12 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar22);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,") ",2);
    pcVar25 = (char *)exr_get_default_error_message(iVar22);
    if (pcVar25 == (char *)0x0) {
      std::ios::clear((int)poVar12 + (int)*(undefined8 *)(*(long *)poVar12 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar25);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,pcVar25,sVar11);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
    std::ostream::put((char)poVar12);
    std::ostream::flush();
    core_test_fail("exr_finish (&f)",(char *)0x53b,0x179b65,(char *)ppVar19);
  }
  cpprestore._w = 0;
  cpprestore._h = 0;
  cpprestore._stride_x = local_500;
  cpprestore._12_4_ = local_504;
  iVar24 = (int32_t)local_4d8;
  cpploadc._h = (int)local_520;
  cpploadc._stride_x = local_4f8;
  cpploadc._12_4_ = local_4fc;
  cpploadcpp._w = 0;
  cpploadcpp._h = 0;
  cpploadc._w = iVar24;
  Imf_3_2::Header::Header
            ((Header *)&restore,(Box *)&cpprestore,(Box *)&cpploadc,1.0,(Vec2 *)&cpploadcpp,1.0,
             INCREASING_Y,ZIP_COMPRESSION);
  peVar15 = (exr_compression_t *)Imf_3_2::Header::compression();
  pcVar25 = (char *)(ulong)comp;
  *peVar15 = comp;
  puVar16 = (undefined4 *)Imf_3_2::Header::zipCompressionLevel();
  *puVar16 = 3;
  iVar22 = Imf_3_2::Header::zipCompressionLevel();
  if (iVar22 != 3) {
    core_test_fail("((const Header&) hdr).zipCompressionLevel () == 3",(char *)0x424,0x17a305,
                   pcVar25);
  }
  pcVar25 = (char *)Imf_3_2::Header::channels();
  Imf_3_2::Channel::Channel((Channel *)&cpprestore,UINT,(int)local_568,(int)local_580,false);
  Imf_3_2::ChannelList::insert(pcVar25,(Channel *)0x18005b);
  lVar27 = 0;
  do {
    pcVar25 = (char *)Imf_3_2::Header::channels();
    pCVar1 = *(Channel **)((long)channels + lVar27);
    Imf_3_2::Channel::Channel((Channel *)&cpprestore,HALF,(int)local_568,(int)local_580,false);
    Imf_3_2::ChannelList::insert(pcVar25,pCVar1);
    lVar27 = lVar27 + 8;
  } while (lVar27 != 0x28);
  pcVar25 = (char *)Imf_3_2::Header::channels();
  Imf_3_2::Channel::Channel((Channel *)&cpprestore,FLOAT,(int)local_568,(int)local_580,false);
  Imf_3_2::ChannelList::insert(pcVar25,(Channel *)0x1800b5);
  lVar27 = local_530;
  pcVar25 = local_548;
  cpploadc.i.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)&cpploadc._stride_x;
  cpploadc._stride_x = 0;
  cpploadc.i.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  cpploadc.f.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_534 = (undefined4)local_520;
  tlevy = iVar24;
  cpploadc.i.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       cpploadc.i.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  Imf_3_2::Slice::Make
            ((PixelType)&cpprestore,(void *)0x0,
             (Vec2 *)(local_558->i).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start,(long)&tlevy,local_530,
             (ulong)local_548,0,local_558->_stride_x << 2,(int)local_568,0.0,SUB81(local_580,0),
             false);
  Imf_3_2::FrameBuffer::insert((char *)&cpploadc,(Slice *)0x18005b);
  Imf_3_2::Slice::Make
            ((PixelType)&cpprestore,(void *)0x1,
             (Vec2 *)(local_558->h).
                     super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                     super__Vector_impl_data._M_start,(long)&tlevy,lVar27,(ulong)pcVar25,0,
             local_558->_stride_x * 2,(int)local_568,0.0,SUB81(local_580,0),false);
  Imf_3_2::FrameBuffer::insert((char *)&cpploadc,(Slice *)0x178bbd);
  Imf_3_2::Slice::Make
            ((PixelType)&cpprestore,(void *)0x2,
             (Vec2 *)(local_558->f).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start,(long)&tlevy,lVar27,(ulong)pcVar25,0,
             local_558->_stride_x << 2,(int)local_568,0.0,SUB81(local_580,0),false);
  Imf_3_2::FrameBuffer::insert((char *)&cpploadc,(Slice *)0x1800b5);
  pvVar30 = local_558->rgba;
  lVar27 = 0;
  do {
    pSVar2 = *(Slice **)((long)channels + lVar27);
    Imf_3_2::Slice::Make
              ((PixelType)&cpprestore,(void *)0x1,
               (Vec2 *)(pvVar30->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                       )._M_impl.super__Vector_impl_data._M_start,(long)&tlevy,local_530,
               (ulong)local_548,0,local_558->_stride_x * 2,(int)local_568,0.0,SUB81(local_580,0),
               false);
    Imf_3_2::FrameBuffer::insert((char *)&cpploadc,pSVar2);
    psVar6 = local_518;
    lVar27 = lVar27 + 8;
    pvVar30 = pvVar30 + 1;
  } while (lVar27 != 0x20);
  if ((char)local_55c == '\0') {
    pcVar25 = (local_518->_M_dataplus)._M_p;
    uVar10 = Imf_3_2::globalThreadCount();
    psVar26 = local_4e0;
    pcVar17 = (char *)(ulong)uVar10;
    Imf_3_2::OutputFile::OutputFile((OutputFile *)&cpprestore,pcVar25,(Header *)&restore,uVar10);
    Imf_3_2::OutputFile::setFrameBuffer((FrameBuffer *)&cpprestore);
    Imf_3_2::OutputFile::writePixels((int)&cpprestore);
    Imf_3_2::OutputFile::~OutputFile((OutputFile *)&cpprestore);
  }
  else {
    cpploadcpp._w = 0x20;
    cpploadcpp._h = 0x20;
    cpploadcpp._stride_x = 0;
    cpploadcpp._12_4_ = 0;
    Imf_3_2::Header::setTileDescription((TileDescription *)&restore);
    psVar26 = local_4e0;
    lVar27 = local_530;
    pcVar17 = local_548;
    pcVar25 = (psVar6->_M_dataplus)._M_p;
    iVar22 = Imf_3_2::globalThreadCount();
    Imf_3_2::TiledOutputFile::TiledOutputFile
              ((TiledOutputFile *)&cpprestore,pcVar25,(Header *)&restore,iVar22);
    Imf_3_2::TiledOutputFile::setFrameBuffer((FrameBuffer *)&cpprestore);
    uVar14 = (ulong)cpploadcpp._0_8_ >> 0x20;
    fVar31 = ceilf((float)(int)lVar27 / (float)(cpploadcpp._0_8_ & 0xffffffff));
    fVar32 = ceilf((float)(int)pcVar17 / (float)uVar14);
    pcVar17 = (char *)0x0;
    Imf_3_2::TiledOutputFile::writeTiles
              ((int)&cpprestore,0,(int)(fVar31 + -1.0),0,(int)(fVar32 + -1.0));
    Imf_3_2::TiledOutputFile::~TiledOutputFile((TiledOutputFile *)&cpprestore);
  }
  std::
  _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
  ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
               *)&cpploadc);
  Imf_3_2::Header::~Header((Header *)&restore);
  pcVar25 = getenv("ENABLE_EXACT_FILE_COMPARE");
  if (pcVar25 != (char *)0x0) {
    iVar22 = compare_files((psVar26->_M_dataplus)._M_p,(psVar6->_M_dataplus)._M_p);
    if (iVar22 != 0) {
      core_test_fail("compare_files",(char *)0x54c,0x179b65,pcVar17);
    }
  }
  compare_files((psVar26->_M_dataplus)._M_p,(psVar6->_M_dataplus)._M_p);
  ppVar19 = local_558;
  pixels::pixels(&restore,local_558);
  pixels::pixels(&cpprestore,ppVar19);
  pixels::pixels(&cpploadc,ppVar19);
  pixels::pixels(&cpploadcpp,ppVar19);
  pixels::fillDead(&restore);
  pixels::fillDead(&cpprestore);
  pixels::fillDead(&cpploadc);
  pixels::fillDead(&cpploadcpp);
  iVar22 = exr_start_read(&f,(psVar26->_M_dataplus)._M_p,local_350);
  if (iVar22 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar12 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar22);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,") ",2);
    pcVar25 = (char *)exr_get_default_error_message(iVar22);
    if (pcVar25 == (char *)0x0) {
      std::ios::clear((int)poVar12 + (int)*(undefined8 *)(*(long *)poVar12 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar25);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,pcVar25,sVar11);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
    std::ostream::put((char)poVar12);
    std::ostream::flush();
    core_test_fail("exr_start_read (&f, filename.c_str (), &cinit)",(char *)0x55d,0x179b65,pcVar17);
  }
  pcVar25 = local_580;
  if ((char)local_55c == '\0') {
    doDecodeScan(f,&restore,(int)local_568,(int)local_580);
  }
  else {
    doDecodeTile(f,&restore,(int)local_568,(int)local_580);
  }
  iVar22 = exr_finish(&f);
  if (iVar22 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar12 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar22);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,") ",2);
    pcVar17 = (char *)exr_get_default_error_message(iVar22);
    if (pcVar17 == (char *)0x0) {
      std::ios::clear((int)poVar12 + (int)*(undefined8 *)(*(long *)poVar12 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar17);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,pcVar17,sVar11);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
    std::ostream::put((char)poVar12);
    std::ostream::flush();
    core_test_fail("exr_finish (&f)",(char *)0x562,0x179b65,pcVar25);
  }
  iVar22 = exr_start_read(&f,(psVar6->_M_dataplus)._M_p,local_350);
  if (iVar22 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar12 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar22);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,") ",2);
    pcVar17 = (char *)exr_get_default_error_message(iVar22);
    if (pcVar17 == (char *)0x0) {
      std::ios::clear((int)poVar12 + (int)*(undefined8 *)(*(long *)poVar12 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar17);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,pcVar17,sVar11);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
    std::ostream::put((char)poVar12);
    std::ostream::flush();
    core_test_fail("exr_start_read (&f, cppfilename.c_str (), &cinit)",(char *)0x564,0x179b65,
                   pcVar25);
  }
  pcVar25 = local_580;
  if ((char)local_55c == '\0') {
    doDecodeScan(f,&cpprestore,(int)local_568,(int)local_580);
  }
  else {
    doDecodeTile(f,&cpprestore,(int)local_568,(int)local_580);
  }
  iVar22 = exr_finish(&f);
  if (iVar22 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Return Error: (",0xf);
    poVar12 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,iVar22);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,") ",2);
    pcVar17 = (char *)exr_get_default_error_message(iVar22);
    if (pcVar17 == (char *)0x0) {
      std::ios::clear((int)poVar12 + (int)*(undefined8 *)(*(long *)poVar12 + -0x18));
    }
    else {
      sVar11 = strlen(pcVar17);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,pcVar17,sVar11);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
    std::ostream::put((char)poVar12);
    std::ostream::flush();
    core_test_fail("exr_finish (&f)",(char *)0x569,0x179b65,pcVar25);
  }
  tiled_00 = SUB81(local_530,0);
  iVar23 = (int)local_548;
  iVar22 = (int)local_4d8;
  iVar8 = (int)local_520;
  loadCPP(&cpploadcpp,(string *)(psVar6->_M_dataplus)._M_p,tiled_00,iVar23,iVar22,iVar8,
          in_stack_fffffffffffffa78);
  loadCPP(&cpploadc,(string *)(psVar26->_M_dataplus)._M_p,tiled_00,iVar23,iVar22,iVar8,
          in_stack_fffffffffffffa78);
  if (comp - EXR_COMPRESSION_LAST_TYPE < 0xfffffffe) {
    pixels::compareExact(&cpploadcpp,&cpploadc,"C++ loaded C","C++ loaded C++");
    pixels::compareExact(&restore,&cpprestore,"C loaded C++","C loaded C");
    pixels::compareExact(&restore,&cpploadc,"C++ loaded C","C loaded C");
    pixels::compareExact(&restore,&cpploadcpp,"C++ loaded C++","C loaded C");
    if (comp < EXR_COMPRESSION_PIZ) {
      pixels::compareExact(&restore,local_558,"orig","C loaded C");
      goto LAB_0010e725;
    }
  }
  pixels::compareClose(&restore,local_558,comp,"orig","C loaded C");
LAB_0010e725:
  remove((psVar26->_M_dataplus)._M_p);
  remove((psVar6->_M_dataplus)._M_p);
  lVar27 = 0xb0;
  do {
    pvVar3 = *(void **)((long)&local_2f8 + lVar27);
    if (pvVar3 != (void *)0x0) {
      operator_delete(pvVar3,*(long *)((long)cpploadcpp.rgba + lVar27 + -0x58) - (long)pvVar3);
    }
    lVar27 = lVar27 + -0x18;
  } while (lVar27 != 0x50);
  if (cpploadcpp.h.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(cpploadcpp.h.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)cpploadcpp.h.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)cpploadcpp.h.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (cpploadcpp.f.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(cpploadcpp.f.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)cpploadcpp.f.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)cpploadcpp.f.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (cpploadcpp.i.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(cpploadcpp.i.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)cpploadcpp.i.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)cpploadcpp.i.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  lVar27 = 0xb0;
  do {
    pvVar3 = *(void **)((long)&cpprestore.rgba[3].
                               super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                               _M_impl.super__Vector_impl_data._M_finish + lVar27);
    if (pvVar3 != (void *)0x0) {
      operator_delete(pvVar3,*(long *)((long)cpploadc.rgba + lVar27 + -0x58) - (long)pvVar3);
    }
    lVar27 = lVar27 + -0x18;
  } while (lVar27 != 0x50);
  if (cpploadc.h.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(cpploadc.h.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)cpploadc.h.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)cpploadc.h.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (cpploadc.f.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(cpploadc.f.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)cpploadc.f.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)cpploadc.f.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (cpploadc.i.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(cpploadc.i.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)cpploadc.i.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)cpploadc.i.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  lVar27 = 0xb0;
  do {
    pvVar3 = *(void **)((long)cpprestore.rgba + lVar27 + -0x68);
    if (pvVar3 != (void *)0x0) {
      operator_delete(pvVar3,*(long *)((long)cpprestore.rgba + lVar27 + -0x58) - (long)pvVar3);
    }
    lVar27 = lVar27 + -0x18;
  } while (lVar27 != 0x50);
  if (cpprestore.h.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(cpprestore.h.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)cpprestore.h.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)cpprestore.h.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (cpprestore.f.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(cpprestore.f.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)cpprestore.f.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)cpprestore.f.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (cpprestore.i.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(cpprestore.i.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)cpprestore.i.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)cpprestore.i.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  lVar27 = 0xb0;
  do {
    pvVar3 = *(void **)((long)&cpploadcpp.rgba[3].
                               super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage + lVar27);
    if (pvVar3 != (void *)0x0) {
      operator_delete(pvVar3,*(long *)((long)restore.rgba + lVar27 + -0x58) - (long)pvVar3);
    }
    lVar27 = lVar27 + -0x18;
  } while (lVar27 != 0x50);
  if (restore.h.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(restore.h.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)restore.h.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)restore.h.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (restore.f.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(restore.f.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)restore.f.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)restore.f.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (restore.i.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(restore.i.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)restore.i.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)restore.i.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

static void
doWriteRead (
    pixels&            p,
    const std::string& filename,
    const std::string& cppfilename,
    bool               tiled,
    int                xs,
    int                ys,
    exr_compression_t  comp,
    const char*        pattern)
{
    exr_context_t             f;
    int                       partidx;
    int                       fw    = p._w * xs;
    int                       fh    = p._h * ys;
    int                       dwx   = IMG_DATA_X * xs;
    int                       dwy   = IMG_DATA_Y * ys;
    exr_context_initializer_t cinit = EXR_DEFAULT_CONTEXT_INITIALIZER;
    exr_attr_box2i_t          dataW;

    exr_set_default_zip_compression_level (-1);
    cinit.zip_level = 3;
    cinit.flags |= EXR_CONTEXT_FLAG_WRITE_LEGACY_HEADER;

    dataW.min.x = dwx;
    dataW.min.y = dwy;
    dataW.max.x = dwx + fw - 1;
    dataW.max.y = dwy + fh - 1;

    std::cout << "  " << pattern << " tiled: " << (tiled ? "yes" : "no")
              << " sampling " << xs << ", " << ys << " comp " << (int) comp
              << std::endl;

    EXRCORE_TEST_RVAL (exr_start_write (
        &f, filename.c_str (), EXR_WRITE_FILE_DIRECTLY, &cinit));
    if (tiled)
    {
        EXRCORE_TEST_RVAL (
            exr_add_part (f, "tiled", EXR_STORAGE_TILED, &partidx));
    }
    else
    {
        EXRCORE_TEST_RVAL (
            exr_add_part (f, "scan", EXR_STORAGE_SCANLINE, &partidx));
    }

    EXRCORE_TEST_RVAL (
        exr_initialize_required_attr_simple (f, partidx, fw, fh, comp));
    EXRCORE_TEST_RVAL (exr_set_data_window (f, partidx, &dataW));

    int zlev;
    EXRCORE_TEST_RVAL (exr_get_zip_compression_level (f, partidx, &zlev));
    EXRCORE_TEST (zlev == 3);
    EXRCORE_TEST_RVAL (exr_set_zip_compression_level (f, partidx, 4));
    if (tiled)
    {
        EXRCORE_TEST_RVAL (exr_set_tile_descriptor (
            f, partidx, 32, 32, EXR_TILE_ONE_LEVEL, EXR_TILE_ROUND_UP));
    }

    EXRCORE_TEST_RVAL (exr_add_channel (
        f, partidx, "I", EXR_PIXEL_UINT, EXR_PERCEPTUALLY_LOGARITHMIC, xs, ys));

    for (int c = 0; c < 5; ++c)
    {
        EXRCORE_TEST_RVAL (exr_add_channel (
            f,
            partidx,
            channels[c],
            EXR_PIXEL_HALF,
            EXR_PERCEPTUALLY_LOGARITHMIC,
            xs,
            ys));
    }
    EXRCORE_TEST_RVAL (exr_add_channel (
        f,
        partidx,
        "F",
        EXR_PIXEL_FLOAT,
        EXR_PERCEPTUALLY_LOGARITHMIC,
        xs,
        ys));

    EXRCORE_TEST_RVAL (exr_write_header (f));
    if (tiled)
        doEncodeTile (f, p, xs, ys);
    else
        doEncodeScan (f, p, xs, ys);
    EXRCORE_TEST_RVAL (exr_finish (&f));

    try
    {
        saveCPP (p, cppfilename, tiled, xs, ys, comp, fw, fh, dwx, dwy);
    }
    catch (std::exception& e)
    {
        std::cerr << "ERROR saving " << cppfilename << ": " << e.what ()
                  << std::endl;
        EXRCORE_TEST_FAIL (saveCPP);
    }

#ifdef __linux
    if (getenv ("ENABLE_EXACT_FILE_COMPARE") &&
        0 != compare_files (filename.c_str(), cppfilename.c_str()))
    {
        EXRCORE_TEST_FAIL (compare_files);
    }
    else
    {
        compare_files (filename.c_str(), cppfilename.c_str());
    }
#endif
    pixels restore    = p;
    pixels cpprestore = p;
    pixels cpploadc   = p;
    pixels cpploadcpp = p;

    restore.fillDead ();
    cpprestore.fillDead ();
    cpploadc.fillDead ();
    cpploadcpp.fillDead ();

    EXRCORE_TEST_RVAL (exr_start_read (&f, filename.c_str (), &cinit));
    if (tiled)
        doDecodeTile (f, restore, xs, ys);
    else
        doDecodeScan (f, restore, xs, ys);
    EXRCORE_TEST_RVAL (exr_finish (&f));

    EXRCORE_TEST_RVAL (exr_start_read (&f, cppfilename.c_str (), &cinit));
    if (tiled)
        doDecodeTile (f, cpprestore, xs, ys);
    else
        doDecodeScan (f, cpprestore, xs, ys);
    EXRCORE_TEST_RVAL (exr_finish (&f));

    try
    {
        loadCPP (cpploadcpp, cppfilename, tiled, fw, fh, dwx, dwy);
    }
    catch (std::exception& e)
    {
        std::cerr << "ERROR loading " << cppfilename << ": " << e.what ()
                  << std::endl;
        EXRCORE_TEST_FAIL (loadCPP);
    }

    try
    {
        loadCPP (cpploadc, filename, tiled, fw, fh, dwx, dwy);
    }
    catch (std::exception& e)
    {
        std::cerr << "ERROR loading " << filename << ": " << e.what ()
                  << std::endl;
        EXRCORE_TEST_FAIL (loadCPP);
    }

    /* DWAA / DWAB seems to have some small number of ULP differences between C & C++ */
    if (comp != EXR_COMPRESSION_DWAA && comp != EXR_COMPRESSION_DWAB)
    {
        cpploadcpp.compareExact (cpploadc, "C++ loaded C", "C++ loaded C++");
        restore.compareExact (cpprestore, "C loaded C++", "C loaded C");
        restore.compareExact (cpploadc, "C++ loaded C", "C loaded C");
        restore.compareExact (cpploadcpp, "C++ loaded C++", "C loaded C");
    }

    switch (comp)
    {
        case EXR_COMPRESSION_NONE:
        case EXR_COMPRESSION_RLE:
        case EXR_COMPRESSION_ZIP:
        case EXR_COMPRESSION_ZIPS:
            restore.compareExact (p, "orig", "C loaded C");
            break;
        case EXR_COMPRESSION_PIZ:
        case EXR_COMPRESSION_PXR24:
        case EXR_COMPRESSION_B44:
        case EXR_COMPRESSION_B44A:
        case EXR_COMPRESSION_DWAA:
        case EXR_COMPRESSION_DWAB:
            restore.compareClose (p, comp, "orig", "C loaded C");
            break;
        case EXR_COMPRESSION_LAST_TYPE:
        default:
            std::cerr << "Unknown compression type " << (int) (comp)
                      << std::endl;
            EXRCORE_TEST (false);
            break;
    }
    remove (filename.c_str ());
    remove (cppfilename.c_str ());
}